

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

LinkedToken * __thiscall Cache<LinkedToken>::add(Cache<LinkedToken> *this,LinkedToken *data)

{
  long lVar1;
  Entry local_70;
  
  freeInvalidComments(this);
  LinkedToken::LinkedToken(&local_70.data,data);
  lVar1 = std::chrono::_V2::system_clock::now();
  local_70.expiration.__d.__r = (duration)((this->validityTime).__r * 1000000000 + lVar1);
  std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>::
  emplace_back<Cache<LinkedToken>::Entry>(&this->entries,&local_70);
  LinkedToken::~LinkedToken(&local_70.data);
  return &(this->entries).
          super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}